

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void DockNodeTreeUpdateSplitterFindTouchingNode
               (ImGuiDockNode *node,ImGuiAxis axis,int side,
               ImVector<ImGuiDockNode_*> *touching_nodes)

{
  int *piVar1;
  ImGuiDockNode **ppIVar2;
  int iVar3;
  ImGuiDockNode **ppIVar4;
  int iVar5;
  int iVar6;
  ImGuiDockNode *node_00;
  ImGuiDockNode *pIVar7;
  
  node_00 = node->ChildNodes[0];
  if (node_00 != (ImGuiDockNode *)0x0) {
    ppIVar4 = node->ChildNodes;
    pIVar7 = node;
    do {
      if (((node_00->field_0xbd & 2) != 0) &&
         (((side == 0 || (pIVar7->SplitAxis != axis)) ||
          ((pIVar7->ChildNodes[1]->field_0xbd & 2) == 0)))) {
        DockNodeTreeUpdateSplitterFindTouchingNode(node_00,axis,side,touching_nodes);
      }
      node = pIVar7->ChildNodes[1];
      if ((node->field_0xbd & 2) == 0) {
        return;
      }
      if (((side != 1) && (pIVar7->SplitAxis == axis)) && (((*ppIVar4)->field_0xbd & 2) != 0)) {
        return;
      }
      ppIVar4 = node->ChildNodes;
      node_00 = node->ChildNodes[0];
      pIVar7 = node;
    } while (node_00 != (ImGuiDockNode *)0x0);
  }
  iVar3 = touching_nodes->Size;
  if (iVar3 == touching_nodes->Capacity) {
    if (iVar3 == 0) {
      iVar5 = 8;
    }
    else {
      iVar5 = iVar3 / 2 + iVar3;
    }
    iVar6 = iVar3 + 1;
    if (iVar3 + 1 < iVar5) {
      iVar6 = iVar5;
    }
    if (GImGui != (ImGuiContext *)0x0) {
      piVar1 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar1 = *piVar1 + 1;
    }
    ppIVar4 = (ImGuiDockNode **)(*GImAllocatorAllocFunc)((long)iVar6 << 3,GImAllocatorUserData);
    if (touching_nodes->Data != (ImGuiDockNode **)0x0) {
      memcpy(ppIVar4,touching_nodes->Data,(long)touching_nodes->Size << 3);
      ppIVar2 = touching_nodes->Data;
      if ((ppIVar2 != (ImGuiDockNode **)0x0) && (GImGui != (ImGuiContext *)0x0)) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + -1;
      }
      (*GImAllocatorFreeFunc)(ppIVar2,GImAllocatorUserData);
    }
    touching_nodes->Data = ppIVar4;
    touching_nodes->Capacity = iVar6;
    iVar3 = touching_nodes->Size;
  }
  else {
    ppIVar4 = touching_nodes->Data;
  }
  ppIVar4[iVar3] = node;
  touching_nodes->Size = touching_nodes->Size + 1;
  return;
}

Assistant:

static void DockNodeTreeUpdateSplitterFindTouchingNode(ImGuiDockNode* node, ImGuiAxis axis, int side, ImVector<ImGuiDockNode*>* touching_nodes)
{
    if (node->IsLeafNode())
    {
        touching_nodes->push_back(node);
        return;
    }
    if (node->ChildNodes[0]->IsVisible)
        if (node->SplitAxis != axis || side == 0 || !node->ChildNodes[1]->IsVisible)
            DockNodeTreeUpdateSplitterFindTouchingNode(node->ChildNodes[0], axis, side, touching_nodes);
    if (node->ChildNodes[1]->IsVisible)
        if (node->SplitAxis != axis || side == 1 || !node->ChildNodes[0]->IsVisible)
            DockNodeTreeUpdateSplitterFindTouchingNode(node->ChildNodes[1], axis, side, touching_nodes);
}